

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.h
# Opt level: O2

char __thiscall Bstrlib::CBCharWriteProtected::operator=(CBCharWriteProtected *this,char c)

{
  tagbstring *ptVar1;
  
  ptVar1 = this->s;
  if (0 < ptVar1->mlen) {
    if ((uint)ptVar1->slen <= this->idx) {
      return '\0';
    }
    ptVar1->data[this->idx] = c;
    ptVar1 = this->s;
  }
  return ptVar1->data[this->idx];
}

Assistant:

inline char operator = (char c) {
		if (s.mlen <= 0) {
			bstringThrow ("Write protection error");
		} else {
#ifndef BSTRLIB_THROWS_EXCEPTIONS
			if (idx >= (unsigned) s.slen) return '\0';
#endif
			s.data[idx] = (unsigned char) c;
		}
		return (char) s.data[idx];
	}